

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmanager.h
# Opt level: O0

void __thiscall Memory::show(Memory *this)

{
  ostream *poVar1;
  int local_14;
  int i;
  Memory *this_local;
  
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->Mem[local_14].sign);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->Mem[local_14].thread_id);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)&this->Mem[local_14].name);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->Mem[local_14].datasize);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)&this->Mem[local_14].message);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void show() { //显示内存数据
			for(int i=0; i<16; i++) {
				cout<<i<<" "<<Mem[i].sign<<" "<<Mem[i].thread_id<<" "<<Mem[i].name<<" "<<Mem[i].datasize<<" "<<Mem[i].message<<endl;
			}
		}